

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Eigenvalue.hpp
# Opt level: O0

void __thiscall
JAMA::Eigenvalue<double>::Eigenvalue(Eigenvalue<double> *this,DynamicRectMatrix<double> *A)

{
  uint uVar1;
  double *pdVar2;
  DynamicRectMatrix<double> *in_RSI;
  uint *in_RDI;
  bool bVar3;
  double dVar4;
  Eigenvalue<double> *in_stack_00000010;
  int i_2;
  int j_2;
  int j_1;
  int i_1;
  int i;
  int j;
  Eigenvalue<double> *in_stack_00000400;
  allocator_type *in_stack_fffffffffffffe68;
  DynamicVector<double,_std::allocator<double>_> *in_stack_fffffffffffffe70;
  undefined8 in_stack_fffffffffffffe78;
  DynamicRectMatrix<double> *in_stack_fffffffffffffe80;
  DynamicRectMatrix<double> *in_stack_fffffffffffffe90;
  DynamicRectMatrix<double> *in_stack_fffffffffffffe98;
  uint local_dc;
  uint local_d8;
  uint local_94;
  uint local_90;
  uint local_8c;
  uint local_88;
  Eigenvalue<double> *in_stack_ffffffffffffffb0;
  Eigenvalue<double> *in_stack_ffffffffffffffe0;
  
  std::allocator<double>::allocator((allocator<double> *)0x128a98);
  OpenMD::DynamicVector<double,_std::allocator<double>_>::DynamicVector
            (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  std::allocator<double>::~allocator((allocator<double> *)0x128abc);
  std::allocator<double>::allocator((allocator<double> *)0x128ae5);
  OpenMD::DynamicVector<double,_std::allocator<double>_>::DynamicVector
            (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  std::allocator<double>::~allocator((allocator<double> *)0x128b09);
  OpenMD::DynamicRectMatrix<double>::DynamicRectMatrix((DynamicRectMatrix<double> *)(in_RDI + 0xe));
  OpenMD::DynamicRectMatrix<double>::DynamicRectMatrix((DynamicRectMatrix<double> *)(in_RDI + 0x12))
  ;
  std::allocator<double>::allocator((allocator<double> *)0x128b62);
  OpenMD::DynamicVector<double,_std::allocator<double>_>::DynamicVector
            (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  std::allocator<double>::~allocator((allocator<double> *)0x128b80);
  uVar1 = OpenMD::DynamicRectMatrix<double>::getNCol(in_RSI);
  *in_RDI = uVar1;
  OpenMD::DynamicRectMatrix<double>::DynamicRectMatrix
            (in_stack_fffffffffffffe80,(uint)((ulong)in_stack_fffffffffffffe78 >> 0x20),
             (uint)in_stack_fffffffffffffe78);
  OpenMD::DynamicRectMatrix<double>::operator=(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
  OpenMD::DynamicRectMatrix<double>::~DynamicRectMatrix((DynamicRectMatrix<double> *)0x128be4);
  OpenMD::DynamicRectMatrix<double>::~DynamicRectMatrix((DynamicRectMatrix<double> *)0x128bf1);
  std::allocator<double>::allocator((allocator<double> *)0x128c13);
  OpenMD::DynamicVector<double,_std::allocator<double>_>::DynamicVector
            (in_stack_fffffffffffffe70,(size_type)in_stack_fffffffffffffe68,
             (allocator_type *)0x128c2a);
  OpenMD::DynamicVector<double,_std::allocator<double>_>::operator=
            (in_stack_fffffffffffffe70,
             (DynamicVector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe68);
  OpenMD::DynamicVector<double,_std::allocator<double>_>::~DynamicVector
            ((DynamicVector<double,_std::allocator<double>_> *)0x128c54);
  std::allocator<double>::~allocator((allocator<double> *)0x128c61);
  std::allocator<double>::allocator((allocator<double> *)0x128c83);
  OpenMD::DynamicVector<double,_std::allocator<double>_>::DynamicVector
            (in_stack_fffffffffffffe70,(size_type)in_stack_fffffffffffffe68,
             (allocator_type *)0x128c9a);
  OpenMD::DynamicVector<double,_std::allocator<double>_>::operator=
            (in_stack_fffffffffffffe70,
             (DynamicVector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe68);
  OpenMD::DynamicVector<double,_std::allocator<double>_>::~DynamicVector
            ((DynamicVector<double,_std::allocator<double>_> *)0x128cc2);
  std::allocator<double>::~allocator((allocator<double> *)0x128ccf);
  in_RDI[1] = 1;
  local_88 = 0;
  while( true ) {
    bVar3 = false;
    if ((int)local_88 < (int)*in_RDI) {
      bVar3 = in_RDI[1] != 0;
    }
    if (!bVar3) break;
    local_8c = 0;
    while( true ) {
      bVar3 = false;
      if ((int)local_8c < (int)*in_RDI) {
        bVar3 = in_RDI[1] != 0;
      }
      if (!bVar3) break;
      in_stack_fffffffffffffe98 =
           (DynamicRectMatrix<double> *)
           OpenMD::DynamicRectMatrix<double>::operator()(in_RSI,local_8c,local_88);
      in_stack_fffffffffffffe90 =
           (DynamicRectMatrix<double> *)
           OpenMD::DynamicRectMatrix<double>::operator()(in_RSI,local_88,local_8c);
      in_RDI[1] = (uint)((double)in_stack_fffffffffffffe98 == (double)in_stack_fffffffffffffe90);
      local_8c = local_8c + 1;
    }
    local_88 = local_88 + 1;
  }
  if (in_RDI[1] == 0) {
    OpenMD::DynamicRectMatrix<double>::DynamicRectMatrix
              (in_stack_fffffffffffffe80,(uint)((ulong)in_stack_fffffffffffffe78 >> 0x20),
               (uint)in_stack_fffffffffffffe78);
    OpenMD::DynamicRectMatrix<double>::operator=
              (in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
    OpenMD::DynamicRectMatrix<double>::~DynamicRectMatrix((DynamicRectMatrix<double> *)0x129069);
    OpenMD::DynamicRectMatrix<double>::~DynamicRectMatrix((DynamicRectMatrix<double> *)0x129076);
    std::allocator<double>::allocator((allocator<double> *)0x129098);
    OpenMD::DynamicVector<double,_std::allocator<double>_>::DynamicVector
              (in_stack_fffffffffffffe70,(size_type)in_stack_fffffffffffffe68,
               (allocator_type *)0x1290af);
    OpenMD::DynamicVector<double,_std::allocator<double>_>::operator=
              (in_stack_fffffffffffffe70,
               (DynamicVector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe68);
    OpenMD::DynamicVector<double,_std::allocator<double>_>::~DynamicVector
              ((DynamicVector<double,_std::allocator<double>_> *)0x1290d7);
    std::allocator<double>::~allocator((allocator<double> *)0x1290e4);
    for (local_d8 = 0; (int)local_d8 < (int)*in_RDI; local_d8 = local_d8 + 1) {
      for (local_dc = 0; (int)local_dc < (int)*in_RDI; local_dc = local_dc + 1) {
        dVar4 = OpenMD::DynamicRectMatrix<double>::operator()(in_RSI,local_dc,local_d8);
        pdVar2 = OpenMD::DynamicRectMatrix<double>::operator()
                           ((DynamicRectMatrix<double> *)(in_RDI + 0x12),local_dc,local_d8);
        *pdVar2 = dVar4;
      }
    }
    orthes(in_stack_ffffffffffffffb0);
    hqr2(in_stack_00000400);
  }
  else {
    for (local_90 = 0; (int)local_90 < (int)*in_RDI; local_90 = local_90 + 1) {
      for (local_94 = 0; (int)local_94 < (int)*in_RDI; local_94 = local_94 + 1) {
        dVar4 = OpenMD::DynamicRectMatrix<double>::operator()(in_RSI,local_90,local_94);
        pdVar2 = OpenMD::DynamicRectMatrix<double>::operator()
                           ((DynamicRectMatrix<double> *)(in_RDI + 0xe),local_90,local_94);
        *pdVar2 = dVar4;
      }
    }
    tred2(in_stack_ffffffffffffffe0);
    tql2(in_stack_00000010);
  }
  return;
}

Assistant:

Eigenvalue(const DynamicRectMatrix<Real>& A) {
      n = A.getNCol();
      V = DynamicRectMatrix<Real>(n, n);
      d = DynamicVector<Real>(n);
      e = DynamicVector<Real>(n);

      issymmetric = 1;
      for (int j = 0; (j < n) && issymmetric; j++) {
        for (int i = 0; (i < n) && issymmetric; i++) {
          issymmetric = (A(i, j) == A(j, i));
        }
      }

      if (issymmetric) {
        for (int i = 0; i < n; i++) {
          for (int j = 0; j < n; j++) {
            V(i, j) = A(i, j);
          }
        }

        // Tridiagonalize.
        tred2();

        // Diagonalize.
        tql2();

      } else {
        H   = DynamicRectMatrix<Real>(n, n);
        ort = DynamicVector<Real>(n);

        for (int j = 0; j < n; j++) {
          for (int i = 0; i < n; i++) {
            H(i, j) = A(i, j);
          }
        }

        // Reduce to Hessenberg form.
        orthes();

        // Reduce Hessenberg to real Schur form.
        hqr2();
      }
    }